

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O1

uint8_t * quicly_encode_ack_frame
                    (uint8_t *dst,uint8_t *dst_end,quicly_ranges_t *ranges,uint64_t ack_delay)

{
  byte *in_RAX;
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  
  sVar6 = ranges->num_ranges;
  if (sVar6 == 0) {
    __assert_fail("ranges->num_ranges != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                  ,0x2f,
                  "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
                 );
  }
  lVar3 = sVar6 * 0x10;
  *dst = '\x02';
  uVar4 = ranges->ranges[sVar6 - 1].end - 1;
  pbVar2 = dst + 1;
  if (0x3f < uVar4) {
    if (uVar4 < 0x4000) {
      dst[1] = (byte)(uVar4 >> 8) | 0x40;
      pbVar2 = dst + 2;
    }
    else {
      quicly_encode_ack_frame_cold_1();
      pbVar2 = in_RAX;
    }
  }
  *pbVar2 = (byte)uVar4;
  pbVar1 = pbVar2 + 1;
  if (0x3f < ack_delay) {
    if (ack_delay < 0x4000) {
      pbVar2[1] = (byte)(ack_delay >> 8) | 0x40;
      pbVar1 = pbVar2 + 2;
    }
    else {
      quicly_encode_ack_frame_cold_2();
      pbVar1 = in_RAX;
    }
  }
  *pbVar1 = (byte)ack_delay;
  pbVar1[1] = (char)ranges->num_ranges - 1;
  pbVar1 = pbVar1 + 2;
  while( true ) {
    uVar4 = *(ulong *)((long)&ranges->ranges[-1].start + lVar3);
    uVar5 = *(ulong *)((long)ranges->ranges + lVar3 + -8);
    if (uVar5 <= uVar4) {
      __assert_fail("_start < _end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                    ,0x39,
                    "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
                   );
    }
    lVar7 = (long)dst_end - (long)pbVar1;
    if (7 < lVar7) {
      uVar5 = uVar5 + ~uVar4;
      if (0x3f < uVar5) {
        if (uVar5 < 0x4000) {
          *pbVar1 = (byte)(uVar5 >> 8) | 0x40;
          pbVar1 = pbVar1 + 1;
        }
        else {
          quicly_encode_ack_frame_cold_3();
          pbVar1 = in_RAX;
        }
      }
      *pbVar1 = (byte)uVar5;
      pbVar1 = pbVar1 + 1;
    }
    if (lVar7 < 8) {
      return (uint8_t *)0x0;
    }
    sVar6 = sVar6 - 1;
    if (sVar6 == 0) {
      return pbVar1;
    }
    uVar4 = *(ulong *)((long)ranges->ranges + lVar3 + -0x18);
    uVar5 = *(ulong *)((long)&ranges->ranges[-1].start + lVar3);
    if (uVar5 <= uVar4) break;
    lVar7 = (long)dst_end - (long)pbVar1;
    if (7 < lVar7) {
      uVar5 = uVar5 + ~uVar4;
      if (0x3f < uVar5) {
        if (uVar5 < 0x4000) {
          *pbVar1 = (byte)(uVar5 >> 8) | 0x40;
          pbVar1 = pbVar1 + 1;
        }
        else {
          quicly_encode_ack_frame_cold_4();
          pbVar1 = in_RAX;
        }
      }
      *pbVar1 = (byte)uVar5;
      pbVar1 = pbVar1 + 1;
    }
    lVar3 = lVar3 + -0x10;
    if (lVar7 < 8) {
      return (uint8_t *)0x0;
    }
  }
  __assert_fail("_start < _end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                ,0x3c,
                "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
               );
}

Assistant:

uint8_t *quicly_encode_ack_frame(uint8_t *dst, uint8_t *dst_end, quicly_ranges_t *ranges, uint64_t ack_delay)
{
#define WRITE_BLOCK(start, end)                                                                                                    \
    do {                                                                                                                           \
        uint64_t _start = (start), _end = (end);                                                                                   \
        assert(_start < _end);                                                                                                     \
        if (dst_end - dst < 8)                                                                                                     \
            return NULL;                                                                                                           \
        dst = quicly_encodev(dst, _end - _start - 1);                                                                              \
    } while (0)

    size_t range_index = ranges->num_ranges - 1;

    assert(ranges->num_ranges != 0);

    /* number of bytes being emitted without space check are 1 + 8 + 8 + 1 bytes (as defined in QUICLY_ACK_FRAME_CAPACITY) */
    *dst++ = QUICLY_FRAME_TYPE_ACK;
    dst = quicly_encodev(dst, ranges->ranges[range_index].end - 1); /* largest acknowledged */
    dst = quicly_encodev(dst, ack_delay);                           /* ack delay */
    PTLS_BUILD_ASSERT(QUICLY_MAX_ACK_BLOCKS - 1 <= 63);
    *dst++ = (uint8_t)(ranges->num_ranges - 1); /* ack blocks */

    while (1) {
        WRITE_BLOCK(ranges->ranges[range_index].start, ranges->ranges[range_index].end); /* ACK block count */
        if (range_index-- == 0)
            break;
        WRITE_BLOCK(ranges->ranges[range_index].end, ranges->ranges[range_index + 1].start);
    }

    return dst;

#undef WRITE_BLOCK
}